

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O3

Foo2 * squall::detail::Fetch<Foo2_*,_(squall::detail::FetchContext)0>::doit
                 (HSQUIRRELVM vm,SQInteger index)

{
  bool bVar1;
  KlassTable *this;
  SQUserPointer r;
  HSQOBJECT sqo;
  Foo2 *local_30;
  HSQOBJECT local_28;
  
  this = (KlassTable *)sq_getforeignptr(vm);
  bVar1 = KlassTable::find_klass_object<Foo2>(this,&local_28);
  if (bVar1) {
    check_argument_type<(squall::detail::FetchContext)0>(vm,index,OT_INSTANCE);
    sq_getinstanceup(vm,index,&local_30,(SQUserPointer)0x0);
  }
  else {
    check_argument_type<(squall::detail::FetchContext)0>(vm,index,OT_USERPOINTER);
    sq_getuserpointer(vm,index,&local_30);
  }
  return local_30;
}

Assistant:

static T* doit(HSQUIRRELVM vm, SQInteger index) {
        HSQOBJECT sqo;
        if (klass_table(vm).find_klass_object<T>(sqo)) {
            check_argument_type<FC>(vm, index, OT_INSTANCE);
            SQUserPointer r;
            sq_getinstanceup(vm, index, &r, NULL);
            return (T*)r;
        } else {
            return (T*)getdata<SQUserPointer, FC>(
                vm, index, OT_USERPOINTER, sq_getuserpointer);
        }
    }